

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O1

SC_Cell * Abc_SclFindSmallestGate(SC_Cell *p,float CinMin)

{
  SC_Cell *pSVar1;
  SC_Cell *pSVar2;
  void *pvVar3;
  SC_Cell **ppSVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  float fVar9;
  
  iVar5 = 0;
  ppSVar4 = &p->pRepr;
  while( true ) {
    pSVar1 = *ppSVar4;
    if ((iVar5 != 0) && (pSVar2 = p->pRepr, pSVar1 == pSVar2)) {
      return pSVar2->pPrev;
    }
    iVar6 = pSVar1->n_inputs;
    if ((long)iVar6 < 1) {
      fVar9 = 0.0;
    }
    else {
      uVar7 = (pSVar1->vPins).nSize;
      if ((int)uVar7 < 1) {
        uVar7 = 0;
      }
      if (uVar7 <= iVar6 - 1U) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      fVar9 = 0.0;
      lVar8 = 0;
      do {
        pvVar3 = (pSVar1->vPins).pArray[lVar8];
        fVar9 = fVar9 + *(float *)((long)pvVar3 + 0x10) * 0.5 +
                        *(float *)((long)pvVar3 + 0x14) * 0.5;
        lVar8 = lVar8 + 1;
      } while (iVar6 != lVar8);
    }
    if (iVar6 < 2) {
      iVar6 = 1;
    }
    if (CinMin < fVar9 / (float)iVar6) break;
    ppSVar4 = &pSVar1->pNext;
    iVar5 = iVar5 + 1;
  }
  return pSVar1;
}

Assistant:

SC_Cell * Abc_SclFindSmallestGate( SC_Cell * p, float CinMin )
{
    SC_Cell * pRes = NULL;
    int i;
    SC_RingForEachCell( p->pRepr, pRes, i )
        if ( SC_CellPinCapAve(pRes) > CinMin )
            return pRes;
    // take the largest gate
    return p->pRepr->pPrev;
}